

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O2

void __thiscall depspawn::internal::TaskPool::main(TaskPool *this)

{
  while (this->finish_ == false) {
    empty_queue(this);
    LOCK();
    (this->busy_threads_).super___atomic_base<int>._M_i =
         (this->busy_threads_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    while (((this->finish_ == false &&
            ((this->hp_queue_).head_._M_i.index == (this->hp_queue_).tail_._M_i.index)) &&
           ((this->queue_).head_._M_i.index == (this->queue_).tail_._M_i.index))) {
      if ((this->idle_func_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&this->idle_func_);
      }
    }
    LOCK();
    (this->busy_threads_).super___atomic_base<int>._M_i =
         (this->busy_threads_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  (this->busy_threads_).super___atomic_base<int>._M_i =
       (this->busy_threads_).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  return;
}

Assistant:

void main()
  {
    while (!finish_) {
      empty_queue();
      busy_threads_.fetch_sub(1);
      while(!finish_ && empty()) {
        if (idle_func_) {
          idle_func_();
        }
      }
      busy_threads_.fetch_add(1);
    }

    busy_threads_.fetch_sub(1);
  }